

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_difflist_add(lyd_difflist *diff,uint *size,uint index,LYD_DIFFTYPE type,lyd_node *first,
                    lyd_node *second)

{
  uint uVar1;
  LYD_DIFFTYPE *pLVar2;
  LY_ERR *pLVar3;
  lyd_node **pplVar4;
  void *new;
  lyd_node *second_local;
  lyd_node *first_local;
  LYD_DIFFTYPE type_local;
  uint index_local;
  uint *size_local;
  lyd_difflist *diff_local;
  
  if (diff == (lyd_difflist *)0x0) {
    __assert_fail("diff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x96c,
                  "int lyd_difflist_add(struct lyd_difflist *, unsigned int *, unsigned int, LYD_DIFFTYPE, struct lyd_node *, struct lyd_node *)"
                 );
  }
  if ((size == (uint *)0x0) || (*size == 0)) {
    __assert_fail("size && *size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x96d,
                  "int lyd_difflist_add(struct lyd_difflist *, unsigned int *, unsigned int, LYD_DIFFTYPE, struct lyd_node *, struct lyd_node *)"
                 );
  }
  if (index + 1 == *size) {
    *size = *size + 0x10;
    pLVar2 = (LYD_DIFFTYPE *)realloc(diff->type,(ulong)*size << 2);
    if (pLVar2 == (LYD_DIFFTYPE *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_difflist_add");
      return 1;
    }
    diff->type = pLVar2;
    pplVar4 = (lyd_node **)realloc(diff->first,(ulong)*size << 3);
    if (pplVar4 == (lyd_node **)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_difflist_add");
      return 1;
    }
    diff->first = pplVar4;
    pplVar4 = (lyd_node **)realloc(diff->second,(ulong)*size << 3);
    if (pplVar4 == (lyd_node **)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_difflist_add");
      return 1;
    }
    diff->second = pplVar4;
  }
  diff->type[index] = type;
  diff->first[index] = first;
  diff->second[index] = second;
  uVar1 = index + 1;
  diff->type[uVar1] = LYD_DIFF_END;
  diff->first[uVar1] = (lyd_node *)0x0;
  diff->second[uVar1] = (lyd_node *)0x0;
  return 0;
}

Assistant:

static int
lyd_difflist_add(struct lyd_difflist *diff, unsigned int *size, unsigned int index,
                 LYD_DIFFTYPE type, struct lyd_node *first, struct lyd_node *second)
{
    void *new;

    assert(diff);
    assert(size && *size);

    if (index + 1 == *size) {
        /* it's time to enlarge */
        *size = *size + 16;
        new = realloc(diff->type, *size * sizeof *diff->type);
        if (!new) {
            LOGMEM;
            return EXIT_FAILURE;
        }
        diff->type = new;

        new = realloc(diff->first, *size * sizeof *diff->first);
        if (!new) {
            LOGMEM;
            return EXIT_FAILURE;
        }
        diff->first = new;

        new = realloc(diff->second, *size * sizeof *diff->second);
        if (!new) {
            LOGMEM;
            return EXIT_FAILURE;
        }
        diff->second = new;
    }

    /* insert the item */
    diff->type[index] = type;
    diff->first[index] = first;
    diff->second[index] = second;

    /* terminate the arrays */
    index++;
    diff->type[index] = LYD_DIFF_END;
    diff->first[index] = NULL;
    diff->second[index] = NULL;

    return EXIT_SUCCESS;
}